

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  ConstStringParam psVar1;
  iterator __position;
  CommandLineInterface *pCVar2;
  ostream *poVar3;
  FileDescriptor *pFVar4;
  iterator iVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  ConstStringParam file_name;
  int index;
  int iVar7;
  pointer name;
  FileDescriptor *parsed_file;
  FileDescriptor *local_a0;
  DescriptorPool *local_98;
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_90;
  CommandLineInterface *local_88;
  pointer local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_90 = (vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)parsed_files;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (file_name = (this->input_files_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; file_name != psVar1;
        file_name = file_name + 1) {
      DescriptorPool::AddUnusedImportTrackFile(descriptor_pool,file_name,false);
    }
  }
  name = (this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (name == local_80) {
    bVar6 = true;
  }
  else {
    local_78 = &this->direct_dependencies_violation_msg_;
    bVar6 = true;
    local_98 = descriptor_pool;
    local_88 = this;
    do {
      pCVar2 = local_88;
      local_a0 = DescriptorPool::FindFileByName(descriptor_pool,name);
      if (local_a0 == (FileDescriptor *)0x0) {
LAB_002336bd:
        bVar6 = false;
        iVar7 = 1;
      }
      else {
        __position._M_current = *(FileDescriptor ***)(local_90 + 8);
        if (__position._M_current == *(FileDescriptor ***)(local_90 + 0x10)) {
          std::
          vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                    (local_90,__position,&local_a0);
        }
        else {
          *__position._M_current = local_a0;
          *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
        }
        if ((pCVar2->disallow_services_ == true) && (0 < *(int *)(local_a0 + 0x34))) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)**(undefined8 **)local_a0,
                              (*(undefined8 **)local_a0)[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,": This file contains services, but --disallow_services was used.",0x40)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          goto LAB_002336bd;
        }
        if (pCVar2->direct_dependencies_explicitly_set_ == true) {
          index = 0;
          iVar7 = index;
          if (0 < *(int *)(local_a0 + 0x20)) {
            iVar7 = 0;
            do {
              pFVar4 = FileDescriptor::dependency(local_a0,index);
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&(this->direct_dependencies_)._M_t,*(key_type **)pFVar4);
              if ((_Rb_tree_header *)iVar5._M_node ==
                  &(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header) {
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)**(undefined8 **)local_a0,
                                    (*(undefined8 **)local_a0)[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"%s","");
                pFVar4 = FileDescriptor::dependency(local_a0,index);
                StringReplace(&local_50,local_78,&local_70,*(string **)pFVar4,true);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
                std::ostream::put((char)poVar3);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                iVar7 = 1;
              }
              index = index + 1;
              descriptor_pool = local_98;
            } while (index < *(int *)(local_a0 + 0x20));
          }
          if (iVar7 != 0) {
            bVar6 = false;
          }
        }
        else {
          iVar7 = 0;
        }
      }
    } while ((iVar7 == 0) && (name = name + 1, name != local_80));
  }
  DescriptorPool::ClearUnusedImportTrackFiles(descriptor_pool);
  return bVar6;
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddUnusedImportTrackFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == NULL) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }


    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearUnusedImportTrackFiles();
  return result;
}